

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

Vec_Str_t * Vec_StrAlloc(int nCap)

{
  Vec_Str_t *pVVar1;
  char *pcVar2;
  int iVar3;
  
  pVVar1 = (Vec_Str_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nCap - 1U) {
    iVar3 = nCap;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)malloc((long)iVar3);
  }
  pVVar1->pArray = pcVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Str_t * Vec_StrAlloc( int nCap )
{
    Vec_Str_t * p;
    p = ABC_ALLOC( Vec_Str_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( char, p->nCap ) : NULL;
    return p;
}